

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_parser.c
# Opt level: O0

uint8_t * apx_signatureParser_parse_limits_u64
                    (apx_signatureParser_t *self,uint8_t *begin,uint8_t *end)

{
  uint8_t *puVar1;
  uint64_t local_48;
  uint64_t upper_limit;
  uint64_t lower_limit;
  uint8_t *result;
  uint8_t *next;
  uint8_t *end_local;
  uint8_t *begin_local;
  apx_signatureParser_t *self_local;
  
  self_local = (apx_signatureParser_t *)begin;
  if (begin < end) {
    lower_limit = 0;
    result = begin + 1;
    if (*begin == '(') {
      next = end;
      end_local = begin;
      begin_local = (uint8_t *)self;
      result = bstr_lstrip(result,end);
      if (result < next) {
        lower_limit = (uint64_t)apx_parserBase_parse_u64(result,next,&upper_limit);
        if (result < lower_limit) {
          result = (uint8_t *)lower_limit;
          puVar1 = bstr_lstrip((uint8_t *)lower_limit,next);
          if (puVar1 < next) {
            result = puVar1 + 1;
            if (*puVar1 == ',') {
              result = bstr_lstrip(result,next);
              if (result < next) {
                lower_limit = (uint64_t)apx_parserBase_parse_u64(result,next,&local_48);
                if (result < lower_limit) {
                  result = (uint8_t *)lower_limit;
                  apx_dataElement_set_limits_uint64
                            (*(apx_dataElement_t **)(*(long *)begin_local + 8),upper_limit,local_48)
                  ;
                  puVar1 = bstr_lstrip(result,next);
                  if (puVar1 < next) {
                    self_local = (apx_signatureParser_t *)(puVar1 + 1);
                    if (*puVar1 != ')') {
                      self_local = (apx_signatureParser_t *)0x0;
                    }
                  }
                  else {
                    self_local = (apx_signatureParser_t *)0x0;
                  }
                }
                else {
                  self_local = (apx_signatureParser_t *)0x0;
                }
              }
              else {
                self_local = (apx_signatureParser_t *)0x0;
              }
            }
            else {
              self_local = (apx_signatureParser_t *)0x0;
            }
          }
          else {
            self_local = (apx_signatureParser_t *)0x0;
          }
        }
        else {
          self_local = (apx_signatureParser_t *)0x0;
        }
      }
      else {
        self_local = (apx_signatureParser_t *)0x0;
      }
    }
  }
  return (uint8_t *)self_local;
}

Assistant:

static uint8_t const* apx_signatureParser_parse_limits_u64(apx_signatureParser_t* self, uint8_t const* begin, uint8_t const* end)
{
   uint8_t const* next = begin;
   if (next < end)
   {
      uint8_t const* result = NULL;
      if (*next++ != '(')
      {
         return begin;
      }
      next = bstr_lstrip(next, end);
      if (next >= end)
      {
         return NULL;
      }
      uint64_t lower_limit, upper_limit;
      result = apx_parserBase_parse_u64(next, end, &lower_limit);
      if (result > next)
      {
         next = result;
      }
      else
      {
         return NULL;
      }
      next = bstr_lstrip(next, end);
      if (next >= end)
      {
         return NULL;
      }
      if (*next++ != ',')
      {
         return NULL;
      }
      next = bstr_lstrip(next, end);
      if (next >= end)
      {
         return NULL;
      }
      result = apx_parserBase_parse_u64(next, end, &upper_limit);
      if (result > next)
      {
         next = result;
      }
      else
      {
         return NULL;
      }
      apx_dataElement_set_limits_uint64(self->state->data_element, lower_limit, upper_limit);
      next = bstr_lstrip(next, end);
      if (next >= end)
      {
         return NULL;
      }
      if (*next++ != ')')
      {
         return NULL;
      }
      return next;
   }
   return begin;
}